

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O3

void __thiscall UnifiedRegex::ContStack::Print(ContStack *this,DebugWriter *w,Char *input)

{
  Cont *pCVar1;
  Iterator local_48;
  
  local_48.super_Iterator.nextTop =
       (this->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
       super_ContinuousPageStack<1UL>.nextTop;
  local_48.topElementSize =
       (this->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).topElementSize;
  if ((this->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
      super_ContinuousPageStack<1UL>.nextTop != 0) {
    local_48.stack = &this->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>;
    do {
      DebugWriter::Print(w,L"%4llu: ");
      pCVar1 = ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>::Iterator::operator*
                         (&local_48);
      (**pCVar1->_vptr_Cont)(pCVar1,w,input);
      ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>::Iterator::operator++
                (&local_48);
    } while (local_48.super_Iterator.nextTop != 0);
  }
  return;
}

Assistant:

void ContStack::Print(DebugWriter* w, const Char* const input) const
    {
        for (Iterator it(*this); it; ++it)
        {
            w->Print(_u("%4llu: "), static_cast<unsigned long long>(it.Position()));
            it->Print(w, input);
        }
    }